

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake.c
# Opt level: O1

decaf_error_t decaf_sha3_update(decaf_keccak_sponge_s *decaf_sponge,uint8_t *in,size_t len)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  bVar1 = decaf_sponge->params[0].rate;
  if (bVar1 <= decaf_sponge->params[0].position) {
    __assert_fail("decaf_sponge->params->position < decaf_sponge->params->rate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                  ,0x5d,
                  "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
                 );
  }
  if (199 < bVar1) {
    __assert_fail("decaf_sponge->params->rate < sizeof(decaf_sponge->state)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                  ,0x5e,
                  "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
                 );
  }
  if (decaf_sponge->params[0].flags != 'A') {
    __assert_fail("decaf_sponge->params->flags == FLAG_ABSORBING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                  ,0x5f,
                  "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
                 );
  }
  do {
    if (len == 0) break;
    bVar1 = decaf_sponge->params[0].rate;
    bVar2 = decaf_sponge->params[0].position;
    uVar4 = (ulong)bVar2;
    uVar5 = bVar1 - uVar4;
    uVar6 = len - uVar5;
    if (len < uVar5) {
      uVar6 = 0;
      do {
        decaf_sponge->state[0].b[uVar6 + uVar4] =
             decaf_sponge->state[0].b[uVar6 + uVar4] ^ in[uVar6];
        uVar6 = uVar6 + 1;
      } while (len != uVar6);
      decaf_sponge->params[0].position = decaf_sponge->params[0].position + (char)len;
      uVar6 = len;
    }
    else {
      if (bVar1 != bVar2) {
        uVar3 = 0;
        do {
          decaf_sponge->state[0].b[uVar3 + uVar4] =
               decaf_sponge->state[0].b[uVar3 + uVar4] ^ in[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      keccakf(decaf_sponge->state,decaf_sponge->params[0].start_round);
      decaf_sponge->params[0].position = '\0';
      in = in + uVar5;
    }
    bVar7 = uVar5 <= len;
    len = uVar6;
  } while (bVar7);
  return -(uint)(decaf_sponge->params[0].flags == 'A');
}

Assistant:

decaf_error_t decaf_sha3_update (
    struct decaf_keccak_sponge_s * __restrict__ decaf_sponge,
    const uint8_t *in,
    size_t len
) {
    assert(decaf_sponge->params->position < decaf_sponge->params->rate);
    assert(decaf_sponge->params->rate < sizeof(decaf_sponge->state));
    assert(decaf_sponge->params->flags == FLAG_ABSORBING);
    while (len) {
        size_t cando = decaf_sponge->params->rate - decaf_sponge->params->position, i;
        uint8_t* state = &decaf_sponge->state->b[decaf_sponge->params->position];
        if (cando > len) {
            for (i = 0; i < len; i += 1) state[i] ^= in[i];
            decaf_sponge->params->position += (uint8_t)len;
            break;
        } else {
            for (i = 0; i < cando; i += 1) state[i] ^= in[i];
            dokeccak(decaf_sponge);
            len -= cando;
            in += cando;
        }
    }
    return (decaf_sponge->params->flags == FLAG_ABSORBING) ? DECAF_SUCCESS : DECAF_FAILURE;
}